

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall opts::BasicOption::~BasicOption(BasicOption *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__BasicOption_001e5830;
  std::__cxx11::string::~string((string *)(in_RDI + 0xe));
  std::__cxx11::string::~string((string *)(in_RDI + 10));
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

virtual         ~BasicOption()                                                          {}